

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound-core.c
# Opt level: O1

errr init_sound(char *soundstr,int argc,char **argv)

{
  return 1;
}

Assistant:

errr init_sound(const char *soundstr, int argc, char **argv)
{
	int i = 0;
	bool done = false;

	/* Release resources previously allocated if called multiple times. */
	close_sound();

	/* Try the modules in the order specified by sound_modules[] */
	while (sound_modules[i].init && !done) {
		if (!soundstr || streq(soundstr, sound_modules[i].name))
			if (0 == sound_modules[i].init(&hooks, argc, argv))
				done = true;
		i++;
	}

	/* Check that we have a sound module to use */
	if (!done)
		return 1;

	/* Open the platform specific sound system */
	if (!hooks.open_audio_hook)
		return 1;
	if (!hooks.open_audio_hook())
		return 1;

	/* Enable sound */
	event_add_handler(EVENT_SOUND, play_sound, NULL);

	/* Success */
	return (0);
}